

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O0

void __thiscall QDecompressHelper::feed(QDecompressHelper *this,QByteArray *data)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QByteDataBuffer *in_RSI;
  QDecompressHelper *in_RDI;
  long in_FS_OFFSET;
  QDecompressHelper *this_00;
  QDecompressHelper *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  qVar3 = QByteArray::size((QByteArray *)in_RSI);
  in_RDI->totalCompressedBytes = qVar3 + in_RDI->totalCompressedBytes;
  QByteDataBuffer::append(in_RSI,(QByteArray *)in_RDI);
  QByteDataBuffer::bufferCount((QByteDataBuffer *)0x2a90f8);
  QByteDataBuffer::operator[](in_RSI,(qsizetype)in_RDI);
  bVar2 = countInternal(this_00,(QByteArray *)in_RSI);
  if (!bVar2) {
    bVar2 = QString::isEmpty((QString *)0x2a9125);
    if ((bVar2) &&
       (bVar2 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_> *
                           )0x2a9138), bVar2)) {
      std::unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_>::operator->
                ((unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_> *)0x2a914b)
      ;
      errorString(in_RDI);
      QString::operator=((QString *)in_RSI,(QString *)in_RDI);
      QString::~QString((QString *)0x2a9174);
    }
    clear(in_stack_fffffffffffffff0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDecompressHelper::feed(QByteArray &&data)
{
    Q_ASSERT(contentEncoding != None);
    totalCompressedBytes += data.size();
    compressedDataBuffer.append(std::move(data));
    if (!countInternal(compressedDataBuffer[compressedDataBuffer.bufferCount() - 1])) {
        if (errorStr.isEmpty() && countHelper)
            errorStr = countHelper->errorString();
        clear(); // If our counting brother failed then so will we :|
    }
}